

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O3

void __thiscall
OptionParser::parseQualOption(OptionParser *this,string *s2,string *s3,Network *network)

{
  Options *this_00;
  pointer pcVar1;
  int iVar2;
  int iVar3;
  InputError *pIVar4;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  string s2U;
  string s3U;
  
  Utilities::upperCase((string *)local_70,s2);
  iVar2 = Utilities::findFullMatch((string *)local_70,epanetQualKeywords);
  this_00 = &network->options;
  if (iVar2 < 0) {
    s2U.field_2._8_8_ = &s3U._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&s2U.field_2 + 8),"CHEMICAL","");
    Options::setOption(this_00,QUAL_MODEL,(string *)((long)&s2U.field_2 + 8));
    if ((size_type *)s2U.field_2._8_8_ != &s3U._M_string_length) {
      operator_delete((void *)s2U.field_2._8_8_);
    }
    Options::setOption(this_00,QUAL_NAME,s2);
    iVar2 = 3;
    Options::setOption(this_00,QUAL_TYPE,3);
  }
  else {
    Options::setOption(this_00,QUAL_MODEL,(string *)local_70);
    Options::setOption(this_00,QUAL_NAME,(string *)local_70);
    Options::setOption(this_00,QUAL_TYPE,iVar2);
  }
  Options::setOption(this_00,QUAL_UNITS,iVar2);
  iVar2 = (network->options).indexOptions[8];
  if (iVar2 == 2) {
    if (s3->_M_string_length == 0) {
      pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      pcVar1 = (s3->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar1,pcVar1 + s3->_M_string_length);
      InputError::InputError(pIVar4,5,&local_d0);
      __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
    }
    iVar2 = Network::indexOf(network,NODE,s3);
    if (iVar2 < 0) {
      pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      pcVar1 = (s3->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar1,pcVar1 + s3->_M_string_length);
      InputError::InputError(pIVar4,5,&local_b0);
      __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
    }
    Options::setOption(this_00,TRACE_NODE,iVar2);
    Options::setOption(this_00,TRACE_NODE_NAME,s3);
    iVar2 = (network->options).indexOptions[8];
  }
  if ((iVar2 == 3) && (s3->_M_string_length != 0)) {
    Utilities::upperCase((string *)((long)&s2U.field_2 + 8),s3);
    iVar2 = std::__cxx11::string::compare(s2U.field_2._M_local_buf + 8);
    if (iVar2 == 0) {
      iVar2 = 3;
    }
    else {
      iVar3 = std::__cxx11::string::compare(s2U.field_2._M_local_buf + 8);
      iVar2 = 4;
      if (iVar3 != 0) {
        pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar1 = (s3->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar1,pcVar1 + s3->_M_string_length);
        InputError::InputError(pIVar4,3,&local_90);
        __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
      }
    }
    Options::setOption(this_00,QUAL_UNITS,iVar2);
    if ((size_type *)s2U.field_2._8_8_ != &s3U._M_string_length) {
      operator_delete((void *)s2U.field_2._8_8_);
    }
  }
  if (local_70 != (undefined1  [8])&s2U._M_string_length) {
    operator_delete((void *)local_70);
  }
  return;
}

Assistant:

void OptionParser::parseQualOption(const string& s2, const string& s3,
                                   Network* network)
{
    string s2U = Utilities::upperCase(s2);
    int i = Utilities::findFullMatch(s2U, epanetQualKeywords);
    if ( i >= 0 )
    {
        network->options.setOption(Options::QUAL_MODEL, s2U);
        network->options.setOption(Options::QUAL_NAME, s2U);
        network->options.setOption(Options::QUAL_TYPE, i);
        network->options.setOption(Options::QUAL_UNITS, i);
    }
    else
    {
        network->options.setOption(Options::QUAL_MODEL, w_CHEMICAL);
        network->options.setOption(Options::QUAL_NAME, s2);
        network->options.setOption(Options::QUAL_TYPE, Options::CHEM);
        network->options.setOption(Options::QUAL_UNITS, Options::MGL);
    }

    if (network->option(Options::QUAL_TYPE) == Options::TRACE)
    {
        if (s3.empty()) throw InputError(InputError::UNDEFINED_OBJECT, s3);
        int nodeIndex = network->indexOf(Element::NODE, s3);
        if (nodeIndex < 0) throw InputError(InputError::UNDEFINED_OBJECT, s3);
        network->options.setOption(Options::TRACE_NODE, nodeIndex);
        network->options.setOption(Options::TRACE_NODE_NAME, s3);
    }

    if (network->option(Options::QUAL_TYPE) == Options::CHEM && !s3.empty())
    {
        string s3U = Utilities::upperCase(s3);
        if (s3U.compare("MG/L") == 0)
            network->options.setOption(Options::QUAL_UNITS, Options::MGL);
        else if (s3U.compare("UG/L") == 0)
            network->options.setOption(Options::QUAL_UNITS, Options::UGL);
        else throw InputError(InputError::INVALID_KEYWORD, s3);
    }
}